

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_reference.c
# Opt level: O2

bool_t prf_external_reference_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint8_t *buffer;
  bool_t bVar1;
  
  if (node->opcode == prf_external_reference_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    buffer = node->data;
    bf_write(bfile,buffer,200);
    bf_put_int8(bfile,buffer[200]);
    bf_put_int8(bfile,buffer[0xc9]);
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0xca));
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0xcc));
    bf_put_int32_be(bfile,*(int32_t *)(buffer + 0xd0));
    bVar1 = 1;
    if (0xd6 < node->length) {
      bf_write(bfile,node->data + 0xd6,node->length - 0xd6);
    }
  }
  else {
    bVar1 = 0;
    prf_error(9,"tried external reference save method on node of type %d.");
  }
  return bVar1;
}

Assistant:

static bool_t
prf_external_reference_save_f(prf_node_t * node,
                              prf_state_t * state,
                              bfile_t * bfile)
{
  int pos;

  assert(node != NULL && bfile != NULL);

  if (node->opcode != prf_external_reference_info.opcode) {
    prf_error(9, "tried external reference save method on node of type %d.",
              node->opcode);
    return FALSE;
  }

  bf_put_uint16_be(bfile, node->opcode);
  bf_put_uint16_be(bfile, node->length);

  pos = 4;
  do {
    node_data * data;
    data = (node_data *) node->data;

    bf_write(bfile, data->filename, 200); pos += 200;
    bf_put_int8(bfile, data->reserved1); pos += 1;
    bf_put_int8(bfile, data->reserved2); pos += 1;
    bf_put_int16_be(bfile, data->reserved3[0]); pos += 2;
    bf_put_int16_be(bfile, data->reserved3[1]); pos += 2;
    bf_put_int32_be(bfile, data->flags); pos += 4;
  } while (FALSE);

  if (node->length > pos)
    pos += bf_write(bfile, node->data + pos - 4 + NODE_DATA_PAD,
                    node->length - pos);

  return TRUE;
}